

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

_Bool testxor16pack(size_t size)

{
  _Bool _Var1;
  xor8_t filter;
  _func_size_t_void_ptr *in_stack_00000050;
  _func_void_void_ptr *in_stack_00000058;
  _func__Bool_uint32_t_void_ptr *in_stack_00000060;
  void *in_stack_00000068;
  size_t in_stack_00000070;
  size_t in_stack_00000078;
  _func_size_t_void_ptr *in_stack_00000090;
  _func_void_void_ptr_char_ptr_size_t *in_stack_00000098;
  _func__Bool_void_ptr_char_ptr_size_t *in_stack_000000a0;
  _func__Bool_uint64_t_ptr_uint32_t_void_ptr *in_stack_000000a8;
  _func__Bool_uint64_t_void_ptr *in_stack_000000b0;
  
  printf("testing xor16 pack/unpack\n");
  _Var1 = test(in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
               in_stack_00000058,in_stack_00000050,in_stack_00000090,in_stack_00000098,
               in_stack_000000a0,in_stack_000000a8,in_stack_000000b0);
  return _Var1;
}

Assistant:

bool testxor16pack(size_t size) {
  printf("testing xor16 pack/unpack\n");
  xor8_t filter;
  return test(size, 0, &filter,
              xor16_allocate_gen,
              xor16_free_gen,
              xor16_size_in_bytes_gen,
              xor16_pack_bytes_gen,
              xor16_pack_gen,
              xor16_unpack_gen,
              xor16_populate_gen,
              xor16_contain_gen);
}